

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

void __thiscall Server::echo_handler(Server *this,connection_hdl *hdl,message_ptr *msg)

{
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  float *pfVar6;
  _Base_ptr p_Var7;
  size_type sVar8;
  int jj;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *other;
  size_type idx;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  *this_00;
  long lVar9;
  float fVar10;
  initializer_list_t init;
  json u;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t_1;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_140;
  _Rb_tree_node_base *local_120;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_118;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_108;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_f8;
  Vector3f v;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  _Any_data local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
             *)&u;
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           (string *)
                           &((msg->
                             super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->m_payload);
  std::endl<char,std::char_traits<char>>(poVar4);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)&t_1,
             &((msg->
               super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->m_payload);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&j,(input_adapter *)&t_1,(parser_callback_t *)&local_58,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t_1.first._M_string_length);
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"type");
  bVar2 = nlohmann::operator==<const_char_*,_0>(pvVar5,"query");
  if (bVar2) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&u,(nullptr_t)0x0);
    for (p_Var7 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->v)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
      ::pair(&t,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
                 *)(p_Var7 + 1));
      if (t.second.first == PT_INT) {
        t_1.first._M_dataplus._M_p._0_4_ = *t.second.second;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<int,_int,_0>(&local_68,(int *)&t_1);
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&u,"result");
        pvVar5 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](pvVar5,&t.first);
        other = &local_68;
LAB_001a27c4:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(pvVar5,other);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(other);
      }
      else {
        if (t.second.first == PT_FLOAT) {
          t_1.first._M_dataplus._M_p._0_4_ = *t.second.second;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<float,_float,_0>(&local_78,(float *)&t_1);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&u,"result");
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[](pvVar5,&t.first);
          other = &local_78;
          goto LAB_001a27c4;
        }
        if (t.second.first == PT_VECTOR3F) {
          Vector3f::Vector3f(&v,(Vector3f *)t.second.second);
          pfVar6 = Vector3f::operator[](&v,0);
          nlohmann::detail::
          json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::json_ref<float_&,_0>
                    ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&t_1,pfVar6);
          pfVar6 = Vector3f::operator[](&v,1);
          nlohmann::detail::
          json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::json_ref<float_&,_0>
                    ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&t_1.second,pfVar6);
          pfVar6 = Vector3f::operator[](&v,2);
          nlohmann::detail::
          json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::json_ref<float_&,_0>(&local_140,pfVar6);
          init._M_len = 3;
          init._M_array = (iterator)&t_1;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json(&local_88,init,true,array);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&u,"result");
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[](pvVar5,&t.first);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar5,&local_88);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_88);
          lVar9 = 0x40;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)((long)&t_1.first._M_dataplus._M_p + lVar9));
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != -0x20);
        }
      }
      std::__cxx11::string::~string((string *)&t);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[6],_char[6],_0>(&local_98,(char (*) [6])"query");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&u,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar5,&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_98);
    std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_f8,&hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    iVar3 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&t.first,&u,-1,' ',false,strict);
    std::__cxx11::string::string((string *)&t_1,t.first._M_dataplus._M_p,(allocator *)&v);
    websocketpp::
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
              ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                *)this,(int)&local_f8,&t_1,1,iVar3);
    std::__cxx11::string::~string((string *)&t_1);
    std::__cxx11::string::~string((string *)&t);
    p_Var1 = &local_f8;
LAB_001a29e5:
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&p_Var1->_M_refcount);
  }
  else {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"type");
    bVar2 = nlohmann::operator==<const_char_*,_0>(pvVar5,"shade");
    if (bVar2) {
      (*this->f)(this->k);
      this->k = true;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&u,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[6],_char[6],_0>(&local_a8,(char (*) [6])"shade");
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&u,"type");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar5,&local_a8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_a8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[8],_char[8],_0>(&local_b8,(char (*) [8])"succeed");
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&u,"result");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar5,&local_b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_b8);
      std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                (&local_108,&hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(&t.first,&u,-1,' ',false,strict);
      std::__cxx11::string::string((string *)&t_1,t.first._M_dataplus._M_p,(allocator *)&v);
      websocketpp::
      endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
                ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                  *)this,(int)&local_108,&t_1,1,iVar3);
      std::__cxx11::string::~string((string *)&t_1);
      std::__cxx11::string::~string((string *)&t);
      p_Var1 = &local_108;
      goto LAB_001a29e5;
    }
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"type");
    bVar2 = nlohmann::operator==<const_char_*,_0>(pvVar5,"edit_parameters");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"unsupported request ");
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&j,"type");
      poVar4 = nlohmann::operator<<(poVar4,pvVar5);
      std::operator<<(poVar4,"\n");
      goto LAB_001a29f2;
    }
    this->k = false;
    u.m_type = null;
    u._1_3_ = 0;
    sVar8 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::count<char_const(&)[6]>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)&j,(char (*) [6])"param");
    if (sVar8 != 0) {
      local_120 = &(this->v)._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var7 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var7 != local_120; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
        ::pair(&t_1,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
                     *)(p_Var7 + 1));
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&j,"param");
        sVar8 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::count<std::__cxx11::string_const&>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)pvVar5,&t_1.first);
        if (sVar8 != 0) {
          u._0_4_ = u._0_4_ + 1;
          if (t_1.second.first == PT_VECTOR3F) {
            Vector3f::Vector3f((Vector3f *)&t,0.0);
            for (idx = 0; idx != 3; idx = idx + 1) {
              pvVar5 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&j,"param");
              pvVar5 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar5,&t_1.first);
              pvVar5 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar5,idx);
              fVar10 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::get<float,_float,_0>(pvVar5);
              pfVar6 = Vector3f::operator[]((Vector3f *)&t,(int)idx);
              *pfVar6 = fVar10;
            }
            Vector3f::operator=((Vector3f *)t_1.second.second,(Vector3f *)&t);
          }
          else if (t_1.second.first == PT_FLOAT) {
            pvVar5 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&j,"param");
            pvVar5 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     ::operator[](pvVar5,&t_1.first);
            fVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     ::get<float,_float,_0>(pvVar5);
            *(float *)t_1.second.second = fVar10;
          }
          else if (t_1.second.first == PT_INT) {
            pvVar5 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)&j,"param");
            pvVar5 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     ::operator[](pvVar5,&t_1.first);
            iVar3 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::get<int,_int,_0>(pvVar5);
            *(int *)t_1.second.second = iVar3;
          }
        }
        std::__cxx11::string::~string((string *)&t_1);
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&t,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[16],_char[16],_0>(&local_c8,(char (*) [16])"edit_parameters");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&t,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar5,&local_c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>(&local_d8,(int *)&u);
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&t,"result");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar5,&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_d8);
    std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_118,&hdl->super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    iVar3 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&t_1.first,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)&t,-1,' ',false,strict);
    websocketpp::
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
              ((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                *)this,(int)&local_118,&t_1,1,iVar3);
    std::__cxx11::string::~string((string *)&t_1);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_118._M_refcount);
    this_00 = &t;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this_00);
LAB_001a29f2:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&j);
  return;
}

Assistant:

void echo_handler(websocketpp::connection_hdl hdl, server::message_ptr msg) {
		std::cerr << (msg->get_payload()) << std::endl;
		auto j = json::parse(msg->get_payload());
		if (j["type"] == "query")
		{
			json u;
			for (auto t : v)
			{
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					u["result"][t.first] = int(*((int*)p.second)); break;
				case PT_FLOAT:
					u["result"][t.first] = float(*((float*)p.second)); break;
				case PT_VECTOR3F:
					Vector3f v = Vector3f(*((Vector3f*)p.second));
					u["result"][t.first] = { v[0],v[1],v[2] }; break;
				}
			}
			u["type"] = "query";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if(j["type"] == "shade")
		{
			f(k); k = 1;
			json u;
			u["type"] = "shade";
			u["result"] = "succeed";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if (j["type"] == "edit_parameters")
		{
			k = 0;
			int edt = 0;
			if(j.count("param"))
			for (auto t : v)
			{
				if (!j["param"].count(t.first)) continue;
				++edt;
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					*((int*)p.second) = (int)j["param"][t.first]; break;
				case PT_FLOAT:
					*((float*)p.second) = (float)j["param"][t.first]; break;
				case PT_VECTOR3F:
					Vector3f tv;
					for (int jj = 0; jj < 3; ++jj) tv[jj] = (float)j["param"][t.first][jj];
					*((Vector3f*)p.second) = tv; break;
				}
			}
			json tmp;
			tmp["type"] = "edit_parameters";
			tmp["result"] = edt;
			m_endpoint.send(hdl, tmp.dump(), websocketpp::frame::opcode::TEXT);
		}
		else
		{
			std::cerr << "unsupported request "<<j["type"]<<"\n";
		}
	}